

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O1

TextElement * __thiscall ninx::parser::element::TextElement::clone_impl(TextElement *this)

{
  pointer pcVar1;
  TextElement *pTVar2;
  
  pTVar2 = (TextElement *)operator_new(0x38);
  (pTVar2->super_Statement).super_ASTElement.parent = (Block *)0x0;
  (pTVar2->super_Statement).super_ASTElement.__output_block = (Block *)0x0;
  (pTVar2->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__TextElement_00150008;
  (pTVar2->text)._M_dataplus._M_p = (pointer)&(pTVar2->text).field_2;
  pcVar1 = (this->text)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->text,pcVar1,pcVar1 + (this->text)._M_string_length);
  return pTVar2;
}

Assistant:

ninx::parser::element::TextElement* ninx::parser::element::TextElement::clone_impl() {
    return new TextElement(this->text);
}